

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.hpp
# Opt level: O0

pair<const_char16_t_*,_char32_t> __thiscall
pstore::utf::utf16_to_code_point<char16_t_const*,unsigned_short(*)(unsigned_short)>
          (utf *this,char16_t *first,char16_t *last,_func_unsigned_short_unsigned_short *swapper)

{
  char16_t cVar1;
  bool bVar2;
  uint16_t code_unit_00;
  ushort uVar3;
  pair<const_char16_t_*,_char32_t> pVar4;
  char32_t cStack_34;
  unsigned_short low;
  char16_t high;
  char16_t code_unit;
  char32_t code_point;
  _func_unsigned_short_unsigned_short *swapper_local;
  char16_t *last_local;
  char16_t *first_local;
  undefined4 local_10;
  
  _high = (code *)last;
  swapper_local = (_func_unsigned_short_unsigned_short *)first;
  if (this == (utf *)first) {
    last_local = (char16_t *)this;
    assert_failed("first != last",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/support/utf.hpp"
                  ,0xd7);
  }
  cStack_34 = L'\0';
  last_local = (char16_t *)(this + 2);
  code_unit_00 = (*(code *)last)(*(undefined2 *)this);
  bVar2 = is_utf16_high_surrogate(code_unit_00);
  if (bVar2) {
    if ((_func_unsigned_short_unsigned_short *)last_local == swapper_local) {
      cStack_34 = L'�';
    }
    else {
      cVar1 = *last_local;
      last_local = last_local + 1;
      uVar3 = (*_high)(cVar1);
      if ((uVar3 < 0xdc00) || (0xdfff < uVar3)) {
        cStack_34 = L'�';
      }
      else {
        cStack_34 = (uVar3 & 0x3ff) + (code_unit_00 & 0x3ff) * 0x400 + 0x10000;
      }
    }
  }
  else {
    cStack_34 = (char32_t)code_unit_00;
  }
  std::pair<const_char16_t_*,_char32_t>::pair<const_char16_t_*&,_char32_t_&,_true>
            ((pair<const_char16_t_*,_char32_t> *)&first_local,&last_local,&stack0xffffffffffffffcc);
  pVar4._12_4_ = 0;
  pVar4.first = first_local;
  pVar4.second = local_10;
  return pVar4;
}

Assistant:

auto utf16_to_code_point (InputIterator first, InputIterator last, SwapperFunction swapper)
            -> std::pair<InputIterator, char32_t> {

            using value_type = typename std::remove_cv<
                typename std::iterator_traits<InputIterator>::value_type>::type;
            static_assert (std::is_same<value_type, char16_t>::value,
                           "iterator must produce char16_t");

            PSTORE_ASSERT (first != last);
            char32_t code_point = 0;
            char16_t const code_unit = swapper (*(first++));
            if (!is_utf16_high_surrogate (code_unit)) {
                code_point = code_unit;
            } else {
                if (first == last) {
                    code_point = replacement_char_code_point;
                } else {
                    auto const high = code_unit;
                    auto const low = swapper (*(first++));

                    if (low < 0xDC00 || low > 0xDFFF) {
                        code_point = replacement_char_code_point;
                    } else {
                        code_point = 0x10000;
                        code_point += (high & 0x03FFU) << 10U;
                        code_point += (low & 0x03FFU);
                    }
                }
            }
            return {first, code_point};
        }